

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component.cpp
# Opt level: O2

bool __thiscall libcellml::Component::removeVariable(Component *this,size_t index)

{
  EntityImpl *pEVar1;
  size_type sVar2;
  VariableImpl *this_00;
  ulong uVar3;
  value_type variable;
  __shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  pEVar1 = (this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl;
  sVar2 = pEVar1[6].mId._M_string_length;
  uVar3 = (long)(pEVar1[6].mId.field_2._M_allocated_capacity - sVar2) >> 4;
  if (index < uVar3) {
    std::__shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_30,
               (__shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2> *)
               (sVar2 + index * 0x10));
    pEVar1 = (this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.
             mPimpl;
    std::
    vector<std::shared_ptr<libcellml::Variable>,_std::allocator<std::shared_ptr<libcellml::Variable>_>_>
    ::erase((vector<std::shared_ptr<libcellml::Variable>,_std::allocator<std::shared_ptr<libcellml::Variable>_>_>
             *)&pEVar1[6].mId._M_string_length,
            (shared_ptr<libcellml::Variable> *)(index * 0x10 + pEVar1[6].mId._M_string_length));
    this_00 = Variable::pFunc(local_30._M_ptr);
    ParentedEntity::ParentedEntityImpl::removeParent((ParentedEntityImpl *)this_00);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  }
  return index < uVar3;
}

Assistant:

bool Component::removeVariable(size_t index)
{
    if (index < pFunc()->mVariables.size()) {
        auto variable = pFunc()->mVariables[index];
        pFunc()->mVariables.erase(pFunc()->mVariables.begin() + ptrdiff_t(index));
        variable->pFunc()->removeParent();
        return true;
    }

    return false;
}